

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::protos::gen::TraceConfig::TraceConfig(TraceConfig *this)

{
  TraceConfig *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__TraceConfig_009c1810;
  std::
  vector<perfetto::protos::gen::TraceConfig_BufferConfig,_std::allocator<perfetto::protos::gen::TraceConfig_BufferConfig>_>
  ::vector(&this->buffers_);
  std::
  vector<perfetto::protos::gen::TraceConfig_DataSource,_std::allocator<perfetto::protos::gen::TraceConfig_DataSource>_>
  ::vector(&this->data_sources_);
  protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_BuiltinDataSource>::CopyablePtr
            (&this->builtin_data_sources_);
  this->duration_ms_ = 0;
  this->enable_extra_guardrails_ = false;
  this->lockdown_mode_ = TraceConfig_LockdownModeOperation_LOCKDOWN_UNCHANGED;
  std::
  vector<perfetto::protos::gen::TraceConfig_ProducerConfig,_std::allocator<perfetto::protos::gen::TraceConfig_ProducerConfig>_>
  ::vector(&this->producers_);
  protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_StatsdMetadata>::CopyablePtr
            (&this->statsd_metadata_);
  this->write_into_file_ = false;
  ::std::__cxx11::string::string((string *)&this->output_path_);
  this->file_write_period_ms_ = 0;
  this->max_file_size_bytes_ = 0;
  protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_GuardrailOverrides>::CopyablePtr
            (&this->guardrail_overrides_);
  this->deferred_start_ = false;
  this->flush_period_ms_ = 0;
  this->flush_timeout_ms_ = 0;
  this->data_source_stop_timeout_ms_ = 0;
  this->notify_traceur_ = false;
  this->bugreport_score_ = 0;
  protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_TriggerConfig>::CopyablePtr
            (&this->trigger_config_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->activate_triggers_);
  protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_IncrementalStateConfig>::CopyablePtr
            (&this->incremental_state_config_);
  this->allow_user_build_tracing_ = false;
  ::std::__cxx11::string::string((string *)&this->unique_session_name_);
  this->compression_type_ = TraceConfig_CompressionType_COMPRESSION_TYPE_UNSPECIFIED;
  protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_IncidentReportConfig>::CopyablePtr
            (&this->incident_report_config_);
  this->statsd_logging_ = TraceConfig_StatsdLogging_STATSD_LOGGING_UNSPECIFIED;
  this->trace_uuid_msb_ = 0;
  this->trace_uuid_lsb_ = 0;
  protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_TraceFilter>::CopyablePtr
            (&this->trace_filter_);
  protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_AndroidReportConfig>::CopyablePtr
            (&this->android_report_config_);
  protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_CmdTraceStartDelay>::CopyablePtr
            (&this->cmd_trace_start_delay_);
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<36UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

TraceConfig::TraceConfig() = default;